

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLapsp.c
# Opt level: O0

void RDL_initializeSPathInfo(RDL_sPathInfo *info,RDL_graph *gra)

{
  uint **ppuVar1;
  char **ppcVar2;
  RDL_graph **ppRVar3;
  RDL_graph *pRVar4;
  uint local_1c;
  uint i;
  RDL_graph *gra_local;
  RDL_sPathInfo *info_local;
  
  ppuVar1 = RDL_alloc2DUIntArray(gra->V,gra->V);
  info->pred = ppuVar1;
  ppuVar1 = RDL_alloc2DUIntArray(gra->V,gra->V);
  info->dist = ppuVar1;
  ppcVar2 = RDL_alloc2DCharArray(gra->V,gra->V);
  info->reachable = ppcVar2;
  ppRVar3 = (RDL_graph **)malloc((ulong)gra->V << 3);
  info->dPaths = ppRVar3;
  for (local_1c = 0; local_1c < gra->V; local_1c = local_1c + 1) {
    pRVar4 = RDL_initNewGraph_g(gra->V,'\0');
    info->dPaths[local_1c] = pRVar4;
  }
  return;
}

Assistant:

static void RDL_initializeSPathInfo(RDL_sPathInfo *info, RDL_graph *gra)
{
  unsigned i;
  info->pred = RDL_alloc2DUIntArray(gra->V, gra->V);
  info->dist = RDL_alloc2DUIntArray(gra->V, gra->V);
  info->reachable = RDL_alloc2DCharArray(gra->V, gra->V);
  info->dPaths = malloc(gra->V * sizeof(*info->dPaths));
  for(i=0; i<gra->V; ++i)
  {
    info->dPaths[i] = RDL_initNewGraph_g(gra->V, 0);
  }
}